

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_connect_websocket_client_impl
          (mg_client_options *client_options,int use_ssl,char *error_buffer,size_t error_buffer_size
          ,char *path,char *origin,char *extensions,mg_websocket_data_handler data_func,
          mg_websocket_close_handler close_func,void *user_data)

{
  mg_connection *conn;
  char *origin_local;
  char *path_local;
  size_t error_buffer_size_local;
  char *error_buffer_local;
  int use_ssl_local;
  mg_client_options *client_options_local;
  
  return (mg_connection *)0x0;
}

Assistant:

static struct mg_connection *
mg_connect_websocket_client_impl(const struct mg_client_options *client_options,
                                 int use_ssl,
                                 char *error_buffer,
                                 size_t error_buffer_size,
                                 const char *path,
                                 const char *origin,
                                 const char *extensions,
                                 mg_websocket_data_handler data_func,
                                 mg_websocket_close_handler close_func,
                                 void *user_data)
{
	struct mg_connection *conn = NULL;

#if defined(USE_WEBSOCKET)
	struct websocket_client_thread_data *thread_data;
	static const char *magic = "x3JJHMbDL1EzLkh9GBhXDw==";

	const char *host = client_options->host;
	int i;

	struct mg_init_data init;
	struct mg_error_data error;

	memset(&init, 0, sizeof(init));
	memset(&error, 0, sizeof(error));
	error.text_buffer_size = error_buffer_size;
	error.text = error_buffer;

#if defined(__clang__)
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif

	/* Establish the client connection and request upgrade */
	conn = mg_connect_client_impl(client_options, use_ssl, &init, &error);

	/* Connection object will be null if something goes wrong */
	if (conn == NULL) {
		/* error_buffer should be already filled ... */
		if (!error_buffer[0]) {
			/* ... if not add an error message */
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            error_buffer,
			            error_buffer_size,
			            "Unexpected error");
		}
		return NULL;
	}

	if (origin != NULL) {
		if (extensions != NULL) {
			i = mg_printf(conn,
			              "GET %s HTTP/1.1\r\n"
			              "Host: %s\r\n"
			              "Upgrade: websocket\r\n"
			              "Connection: Upgrade\r\n"
			              "Sec-WebSocket-Key: %s\r\n"
			              "Sec-WebSocket-Version: 13\r\n"
			              "Sec-WebSocket-Extensions: %s\r\n"
			              "Origin: %s\r\n"
			              "\r\n",
			              path,
			              host,
			              magic,
			              extensions,
			              origin);
		} else {
			i = mg_printf(conn,
			              "GET %s HTTP/1.1\r\n"
			              "Host: %s\r\n"
			              "Upgrade: websocket\r\n"
			              "Connection: Upgrade\r\n"
			              "Sec-WebSocket-Key: %s\r\n"
			              "Sec-WebSocket-Version: 13\r\n"
			              "Origin: %s\r\n"
			              "\r\n",
			              path,
			              host,
			              magic,
			              origin);
		}
	} else {

		if (extensions != NULL) {
			i = mg_printf(conn,
			              "GET %s HTTP/1.1\r\n"
			              "Host: %s\r\n"
			              "Upgrade: websocket\r\n"
			              "Connection: Upgrade\r\n"
			              "Sec-WebSocket-Key: %s\r\n"
			              "Sec-WebSocket-Version: 13\r\n"
			              "Sec-WebSocket-Extensions: %s\r\n"
			              "\r\n",
			              path,
			              host,
			              magic,
			              extensions);
		} else {
			i = mg_printf(conn,
			              "GET %s HTTP/1.1\r\n"
			              "Host: %s\r\n"
			              "Upgrade: websocket\r\n"
			              "Connection: Upgrade\r\n"
			              "Sec-WebSocket-Key: %s\r\n"
			              "Sec-WebSocket-Version: 13\r\n"
			              "\r\n",
			              path,
			              host,
			              magic);
		}
	}
	if (i <= 0) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            error_buffer,
		            error_buffer_size,
		            "%s",
		            "Error sending request");
		mg_close_connection(conn);
		return NULL;
	}

	conn->data_len = 0;
	if (!get_response(conn, error_buffer, error_buffer_size, &i)) {
		mg_close_connection(conn);
		return NULL;
	}
	conn->request_info.local_uri_raw = conn->request_info.request_uri;
	conn->request_info.local_uri = conn->request_info.local_uri_raw;

#if defined(__clang__)
#pragma clang diagnostic pop
#endif

	if (conn->response_info.status_code != 101) {
		/* We sent an "upgrade" request. For a correct websocket
		 * protocol handshake, we expect a "101 Continue" response.
		 * Otherwise it is a protocol violation. Maybe the HTTP
		 * Server does not know websockets. */
		if (!*error_buffer) {
			/* set an error, if not yet set */
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            error_buffer,
			            error_buffer_size,
			            "Unexpected server reply");
		}

		DEBUG_TRACE("Websocket client connect error: %s\r\n", error_buffer);
		mg_close_connection(conn);
		return NULL;
	}

	thread_data = (struct websocket_client_thread_data *)mg_calloc_ctx(
	    1, sizeof(struct websocket_client_thread_data), conn->phys_ctx);
	if (!thread_data) {
		DEBUG_TRACE("%s\r\n", "Out of memory");
		mg_close_connection(conn);
		return NULL;
	}

	thread_data->conn = conn;
	thread_data->data_handler = data_func;
	thread_data->close_handler = close_func;
	thread_data->callback_data = user_data;

	conn->phys_ctx->worker_threadids =
	    (pthread_t *)mg_calloc_ctx(1, sizeof(pthread_t), conn->phys_ctx);
	if (!conn->phys_ctx->worker_threadids) {
		DEBUG_TRACE("%s\r\n", "Out of memory");
		mg_free(thread_data);
		mg_close_connection(conn);
		return NULL;
	}

	/* Now upgrade to ws/wss client context */
	conn->phys_ctx->user_data = user_data;
	conn->phys_ctx->context_type = CONTEXT_WS_CLIENT;
	conn->phys_ctx->cfg_worker_threads = 1; /* one worker thread */

	/* Start a thread to read the websocket client connection
	 * This thread will automatically stop when mg_disconnect is
	 * called on the client connection */
	if (mg_start_thread_with_id(websocket_client_thread,
	                            thread_data,
	                            conn->phys_ctx->worker_threadids)
	    != 0) {
		conn->phys_ctx->cfg_worker_threads = 0;
		mg_free(thread_data);
		mg_close_connection(conn);
		conn = NULL;
		DEBUG_TRACE("%s",
		            "Websocket client connect thread could not be started\r\n");
	}

#else
	/* Appease "unused parameter" warnings */
	(void)client_options;
	(void)use_ssl;
	(void)error_buffer;
	(void)error_buffer_size;
	(void)path;
	(void)origin;
	(void)extensions;
	(void)user_data;
	(void)data_func;
	(void)close_func;
#endif

	return conn;
}